

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

char * helicsBrokerGetAddress(HelicsBroker broker)

{
  int iVar1;
  Broker *pBVar2;
  undefined4 extraout_var;
  string *add;
  Broker *brk;
  HelicsError *in_stack_ffffffffffffffe0;
  HelicsBroker in_stack_ffffffffffffffe8;
  char *local_8;
  
  pBVar2 = getBroker(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (pBVar2 == (Broker *)0x0) {
    local_8 = "";
  }
  else {
    iVar1 = (*pBVar2->_vptr_Broker[0xc])();
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var,iVar1));
  }
  return local_8;
}

Assistant:

const char* helicsBrokerGetAddress(HelicsBroker broker)
{
    auto* brk = getBroker(broker, nullptr);
    if (brk == nullptr) {
        return nullstrPtr;
    }

    const auto& add = brk->getAddress();
    return add.c_str();
}